

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-attack.c
# Opt level: O1

attack_result *
make_ranged_throw(attack_result *__return_storage_ptr__,player *p,object *obj,loc grid)

{
  _Bool _Var1;
  wchar_t wVar2;
  wchar_t wVar3;
  char *buf;
  monster_conflict *mon;
  int iVar4;
  wchar_t wVar5;
  wchar_t b;
  wchar_t s;
  wchar_t local_40;
  wchar_t local_3c;
  uint32_t *local_38;
  
  buf = (char *)mem_alloc(0x14);
  __return_storage_ptr__->success = false;
  __return_storage_ptr__->dmg = L'\0';
  __return_storage_ptr__->msg_type = 0;
  __return_storage_ptr__->hit_verb = buf;
  mon = (monster_conflict *)square_monster(cave,grid);
  local_40 = L'\0';
  local_3c = L'\0';
  my_strcpy(buf,"hits",0x14);
  wVar2 = chance_of_missile_hit(p,obj,(object *)0x0,mon);
  wVar3 = mon->race->ac;
  wVar5 = L'\t';
  if (L'\t' < wVar2) {
    wVar5 = wVar2;
  }
  iVar4 = (int)((ulong)((long)(wVar3 * 2) * 0x55555555) >> 0x20) + wVar3 * -2;
  iVar4 = ((iVar4 >> 1) - (iVar4 >> 0x1f)) + wVar5;
  if (iVar4 < 1) {
    iVar4 = 0;
  }
  _Var1 = random_chance_check((random_chance)
                              ((ulong)(((uint)(iVar4 * 10000) / (uint)wVar5) * 0x206c) / 10000 +
                              0x2710000004b0));
  if (_Var1) {
    local_38 = &__return_storage_ptr__->msg_type;
    __return_storage_ptr__->success = true;
    improve_attack_modifier(p,obj,mon,&local_40,&local_3c,buf,true);
    if ((p->opts).opt[0x2c] == false) {
      wVar3 = ranged_damage(p,mon,obj,(object *)0x0,local_40,local_3c);
      __return_storage_ptr__->dmg = wVar3;
      wVar3 = critical_shot(p,mon,(int)obj->weight,(int)obj->to_h,wVar3,false,local_38);
    }
    else {
      wVar3 = o_ranged_damage(p,mon,obj,(object *)0x0,local_40,local_3c,local_38);
    }
    __return_storage_ptr__->dmg = wVar3;
    _Var1 = flag_has_dbg(obj->flags,5,0x23,"obj->flags","OF_EXPLODE");
    if (_Var1) {
      __return_storage_ptr__->dmg = wVar3 * 3;
    }
    learn_brand_slay_from_throw(p,obj,mon);
  }
  return __return_storage_ptr__;
}

Assistant:

struct attack_result make_ranged_throw(struct player *p,
	struct object *obj, struct loc grid)
{
	char *hit_verb = mem_alloc(20 * sizeof(char));
	struct attack_result result = {false, 0, 0, hit_verb};
	struct monster *mon = square_monster(cave, grid);
	int b = 0, s = 0;

	my_strcpy(hit_verb, "hits", 20);

	/* If we missed then we're done */
	if (!test_hit(chance_of_missile_hit(p, obj, NULL, mon), mon->race->ac))
		return result;

	result.success = true;

	improve_attack_modifier(p, obj, mon, &b, &s, result.hit_verb, true);

	if (!OPT(p, birth_percent_damage)) {
		result.dmg = ranged_damage(p, mon, obj, NULL, b, s);
		result.dmg = critical_shot(p, mon, obj->weight, obj->to_h,
			result.dmg, false, &result.msg_type);
	} else {
		result.dmg = o_ranged_damage(p, mon, obj, NULL, b, s, &result.msg_type);
	}

	/* Direct adjustment for exploding things (flasks of oil) */
	if (of_has(obj->flags, OF_EXPLODE))
		result.dmg *= 3;

	learn_brand_slay_from_throw(p, obj, mon);

	return result;
}